

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O1

string * __thiscall
wabt::Token::to_string_clamp_abi_cxx11_
          (string *__return_storage_ptr__,Token *this,size_t max_length)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  string s;
  
  to_string_abi_cxx11_((string *)local_40,this);
  if (max_length < s._M_dataplus._M_p) {
    std::__cxx11::string::substr((ulong)local_60,(ulong)local_40);
    plVar2 = (long *)std::__cxx11::string::append((string *)local_60,"...");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar3) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_60[0] != local_50) {
      operator_delete(local_60[0]);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_40 == (undefined1  [8])&s._M_string_length) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(s._M_string_length._1_7_,(undefined1)s._M_string_length);
      *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) = s.field_2._M_allocated_capacity;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(s._M_string_length._1_7_,(undefined1)s._M_string_length);
    }
    __return_storage_ptr__->_M_string_length = (size_type)s._M_dataplus._M_p;
    s._M_dataplus._M_p = (pointer)0x0;
    s._M_string_length._0_1_ = 0;
    local_40 = (undefined1  [8])&s._M_string_length;
  }
  if (local_40 != (undefined1  [8])&s._M_string_length) {
    operator_delete((void *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Token::to_string_clamp(size_t max_length) const {
  std::string s = to_string();
  if (s.length() > max_length) {
    return s.substr(0, max_length - 3) + "...";
  } else {
    return s;
  }
}